

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kkt.c
# Opt level: O0

csc * form_KKT(csc *P,csc *A,c_int format,c_float param1,c_float *param2,c_int *PtoKKT,c_int *AtoKKT
              ,c_int **Pdiag_idx,c_int *Pdiag_n,c_int *param2toKKT)

{
  long lVar1;
  csc *pcVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  long in_RCX;
  c_int *in_RDX;
  csc *in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  double in_XMM0_Qa;
  c_int *KKT_TtoC;
  c_int zKKT;
  c_int j;
  c_int i;
  c_int ptr;
  csc *KKT;
  csc *KKT_trip;
  c_int nnzKKTmax;
  c_int nKKT;
  long local_80;
  long local_78;
  long local_70;
  c_int in_stack_ffffffffffffff98;
  c_int in_stack_ffffffffffffffa0;
  c_int in_stack_ffffffffffffffa8;
  csc *local_8;
  
  local_80 = 0;
  pcVar2 = csc_spalloc(*(long *)(in_RDI + 8) + in_RSI->m,
                       *(long *)(*(long *)(in_RDI + 0x18) + *(long *)(in_RDI + 0x10) * 8) +
                       *(long *)(in_RDI + 8) + in_RSI->p[in_RSI->n] + in_RSI->m,
                       in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98
                      );
  if (pcVar2 == (csc *)0x0) {
    local_8 = (csc *)0x0;
  }
  else {
    if (zKKT != 0) {
      pvVar3 = malloc(*(long *)(in_RDI + 8) << 3);
      *(void **)zKKT = pvVar3;
      *(undefined8 *)j = 0;
    }
    for (local_78 = 0; local_78 < *(long *)(in_RDI + 0x10); local_78 = local_78 + 1) {
      if (*(long *)(*(long *)(in_RDI + 0x18) + local_78 * 8) ==
          *(long *)(*(long *)(in_RDI + 0x18) + 8 + local_78 * 8)) {
        pcVar2->i[local_80] = local_78;
        pcVar2->p[local_80] = local_78;
        pcVar2->x[local_80] = in_XMM0_Qa;
        local_80 = local_80 + 1;
      }
      for (lVar5 = *(long *)(*(long *)(in_RDI + 0x18) + local_78 * 8);
          lVar5 < *(long *)(*(long *)(in_RDI + 0x18) + 8 + local_78 * 8); lVar5 = lVar5 + 1) {
        lVar1 = *(long *)(*(long *)(in_RDI + 0x20) + lVar5 * 8);
        pcVar2->i[local_80] = lVar1;
        pcVar2->p[local_80] = local_78;
        pcVar2->x[local_80] = *(c_float *)(*(long *)(in_RDI + 0x28) + lVar5 * 8);
        if (in_R8 != 0) {
          *(long *)(in_R8 + lVar5 * 8) = local_80;
        }
        if ((lVar1 == local_78) &&
           (pcVar2->x[local_80] = in_XMM0_Qa + pcVar2->x[local_80], zKKT != 0)) {
          *(long *)(*(long *)zKKT + *(long *)j * 8) = lVar5;
          *(long *)j = *(long *)j + 1;
        }
        lVar4 = local_80 + 1;
        if ((lVar1 < local_78) &&
           (lVar5 + 1 == *(long *)(*(long *)(in_RDI + 0x18) + 8 + local_78 * 8))) {
          pcVar2->i[lVar4] = local_78;
          pcVar2->p[lVar4] = local_78;
          pcVar2->x[lVar4] = in_XMM0_Qa;
          lVar4 = local_80 + 2;
        }
        local_80 = lVar4;
      }
    }
    if (zKKT != 0) {
      pvVar3 = realloc(*(void **)zKKT,*(long *)j << 3);
      *(void **)zKKT = pvVar3;
    }
    for (local_78 = 0; local_78 < in_RSI->n; local_78 = local_78 + 1) {
      for (lVar5 = in_RSI->p[local_78]; lVar5 < in_RSI->p[local_78 + 1]; lVar5 = lVar5 + 1) {
        pcVar2->p[local_80] = *(long *)(in_RDI + 8) + in_RSI->i[lVar5];
        pcVar2->i[local_80] = local_78;
        pcVar2->x[local_80] = in_RSI->x[lVar5];
        if (in_R9 != 0) {
          *(long *)(in_R9 + lVar5 * 8) = local_80;
        }
        local_80 = local_80 + 1;
      }
    }
    for (local_78 = 0; local_78 < in_RSI->m; local_78 = local_78 + 1) {
      pcVar2->i[local_80] = local_78 + *(long *)(in_RDI + 0x10);
      pcVar2->p[local_80] = local_78 + *(long *)(in_RDI + 0x10);
      pcVar2->x[local_80] = -*(c_float *)(in_RCX + local_78 * 8);
      if (i != 0) {
        *(long *)(i + local_78 * 8) = local_80;
      }
      local_80 = local_80 + 1;
    }
    pcVar2->nz = local_80;
    if (((in_R8 == 0) && (in_R9 == 0)) && (i == 0)) {
      if (in_RDX == (c_int *)0x0) {
        local_8 = triplet_to_csc(in_RSI,(c_int *)0x0);
      }
      else {
        local_8 = triplet_to_csr(in_RSI,in_RDX);
      }
    }
    else {
      pvVar3 = malloc(local_80 << 3);
      if (pvVar3 == (void *)0x0) {
        csc_spfree((csc *)0x27f08c);
        free(*(void **)zKKT);
        return (csc *)0x0;
      }
      if (in_RDX == (c_int *)0x0) {
        local_8 = triplet_to_csc(in_RSI,(c_int *)0x0);
      }
      else {
        local_8 = triplet_to_csr(in_RSI,in_RDX);
      }
      if (in_R8 != 0) {
        for (local_70 = 0;
            local_70 < *(long *)(*(long *)(in_RDI + 0x18) + *(long *)(in_RDI + 0x10) * 8);
            local_70 = local_70 + 1) {
          *(undefined8 *)(in_R8 + local_70 * 8) =
               *(undefined8 *)((long)pvVar3 + *(long *)(in_R8 + local_70 * 8) * 8);
        }
      }
      if (in_R9 != 0) {
        for (local_70 = 0; local_70 < in_RSI->p[in_RSI->n]; local_70 = local_70 + 1) {
          *(undefined8 *)(in_R9 + local_70 * 8) =
               *(undefined8 *)((long)pvVar3 + *(long *)(in_R9 + local_70 * 8) * 8);
        }
      }
      if (i != 0) {
        for (local_70 = 0; local_70 < in_RSI->m; local_70 = local_70 + 1) {
          *(undefined8 *)(i + local_70 * 8) =
               *(undefined8 *)((long)pvVar3 + *(long *)(i + local_70 * 8) * 8);
        }
      }
      free(pvVar3);
    }
    csc_spfree((csc *)0x27f218);
  }
  return local_8;
}

Assistant:

csc* form_KKT(const csc  *P,
              const  csc *A,
              c_int       format,
              c_float     param1,
              c_float    *param2,
              c_int      *PtoKKT,
              c_int      *AtoKKT,
              c_int     **Pdiag_idx,
              c_int      *Pdiag_n,
              c_int      *param2toKKT) {
  c_int  nKKT, nnzKKTmax; // Size, number of nonzeros and max number of nonzeros
                          // in KKT matrix
  csc   *KKT_trip, *KKT;  // KKT matrix in triplet format and CSC format
  c_int  ptr, i, j;       // Counters for elements (i,j) and index pointer
  c_int  zKKT = 0;        // Counter for total number of elements in P and in
                          // KKT
  c_int *KKT_TtoC;        // Pointer to vector mapping from KKT in triplet form
                          // to CSC

  // Get matrix dimensions
  nKKT = P->m + A->m;

  // Get maximum number of nonzero elements (only upper triangular part)
  nnzKKTmax = P->p[P->n] + // Number of elements in P
              P->m +       // Number of elements in param1 * I
              A->p[A->n] + // Number of nonzeros in A
              A->m;        // Number of elements in - diag(param2)

  // Preallocate KKT matrix in triplet format
  KKT_trip = csc_spalloc(nKKT, nKKT, nnzKKTmax, 1, 1);

  if (!KKT_trip) return OSQP_NULL;  // Failed to preallocate matrix

  // Allocate vector of indices on the diagonal. Worst case it has m elements
  if (Pdiag_idx != OSQP_NULL) {
    (*Pdiag_idx) = c_malloc(P->m * sizeof(c_int));
    *Pdiag_n     = 0; // Set 0 diagonal elements to start
  }

  // Allocate Triplet matrices
  // P + param1 I
  for (j = 0; j < P->n; j++) { // cycle over columns
    // No elements in column j => add diagonal element param1
    if (P->p[j] == P->p[j + 1]) {
      KKT_trip->i[zKKT] = j;
      KKT_trip->p[zKKT] = j;
      KKT_trip->x[zKKT] = param1;
      zKKT++;
    }

    for (ptr = P->p[j]; ptr < P->p[j + 1]; ptr++) { // cycle over rows
      // Get current row
      i = P->i[ptr];

      // Add element of P
      KKT_trip->i[zKKT] = i;
      KKT_trip->p[zKKT] = j;
      KKT_trip->x[zKKT] = P->x[ptr];

      if (PtoKKT != OSQP_NULL) PtoKKT[ptr] = zKKT;  // Update index from P to
                                                    // KKTtrip

      if (i == j) {                                 // P has a diagonal element,
                                                    // add param1
        KKT_trip->x[zKKT] += param1;

        // If index vector pointer supplied -> Store the index
        if (Pdiag_idx != OSQP_NULL) {
          (*Pdiag_idx)[*Pdiag_n] = ptr;
          (*Pdiag_n)++;
        }
      }
      zKKT++;

      // Add diagonal param1 in case
      if ((i < j) &&                  // Diagonal element not reached
          (ptr + 1 == P->p[j + 1])) { // last element of column j
        // Add diagonal element param1
        KKT_trip->i[zKKT] = j;
        KKT_trip->p[zKKT] = j;
        KKT_trip->x[zKKT] = param1;
        zKKT++;
      }
    }
  }

  if (Pdiag_idx != OSQP_NULL) {
    // Realloc Pdiag_idx so that it contains exactly *Pdiag_n diagonal elements
    (*Pdiag_idx) = c_realloc((*Pdiag_idx), (*Pdiag_n) * sizeof(c_int));
  }


  // A' at top right
  for (j = 0; j < A->n; j++) {                      // Cycle over columns of A
    for (ptr = A->p[j]; ptr < A->p[j + 1]; ptr++) {
      KKT_trip->p[zKKT] = P->m + A->i[ptr];         // Assign column index from
                                                    // row index of A
      KKT_trip->i[zKKT] = j;                        // Assign row index from
                                                    // column index of A
      KKT_trip->x[zKKT] = A->x[ptr];                // Assign A value element

      if (AtoKKT != OSQP_NULL) AtoKKT[ptr] = zKKT;  // Update index from A to
                                                    // KKTtrip
      zKKT++;
    }
  }

  // - diag(param2) at bottom right
  for (j = 0; j < A->m; j++) {
    KKT_trip->i[zKKT] = j + P->n;
    KKT_trip->p[zKKT] = j + P->n;
    KKT_trip->x[zKKT] = -param2[j];

    if (param2toKKT != OSQP_NULL) param2toKKT[j] = zKKT;  // Update index from
                                                          // param2 to KKTtrip
    zKKT++;
  }

  // Allocate number of nonzeros
  KKT_trip->nz = zKKT;

  // Convert triplet matrix to csc format
  if (!PtoKKT && !AtoKKT && !param2toKKT) {
    // If no index vectors passed, do not store KKT mapping from Trip to CSC/CSR
    if (format == 0) KKT = triplet_to_csc(KKT_trip, OSQP_NULL);
    else KKT = triplet_to_csr(KKT_trip, OSQP_NULL);
  }
  else {
    // Allocate vector of indices from triplet to csc
    KKT_TtoC = c_malloc((zKKT) * sizeof(c_int));

    if (!KKT_TtoC) {
      // Error in allocating KKT_TtoC vector
      csc_spfree(KKT_trip);
      c_free(*Pdiag_idx);
      return OSQP_NULL;
    }

    // Store KKT mapping from Trip to CSC/CSR
    if (format == 0)
      KKT = triplet_to_csc(KKT_trip, KKT_TtoC);
    else
      KKT = triplet_to_csr(KKT_trip, KKT_TtoC);

    // Update vectors of indices from P, A, param2 to KKT (now in CSC format)
    if (PtoKKT != OSQP_NULL) {
      for (i = 0; i < P->p[P->n]; i++) {
        PtoKKT[i] = KKT_TtoC[PtoKKT[i]];
      }
    }

    if (AtoKKT != OSQP_NULL) {
      for (i = 0; i < A->p[A->n]; i++) {
        AtoKKT[i] = KKT_TtoC[AtoKKT[i]];
      }
    }

    if (param2toKKT != OSQP_NULL) {
      for (i = 0; i < A->m; i++) {
        param2toKKT[i] = KKT_TtoC[param2toKKT[i]];
      }
    }

    // Free mapping
    c_free(KKT_TtoC);
  }

  // Clean matrix in triplet format and return result
  csc_spfree(KKT_trip);

  return KKT;
}